

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  char **ppcVar1;
  size_t __n;
  long lVar2;
  NotEnoughMemoryException *this_00;
  ulong uVar3;
  long lVar4;
  char *__src;
  char local_18 [8];
  
  __src = (this->m_currentPosition).m_currentPosition;
  uVar3 = 0;
  if (this->m_lastDataSize < 4) {
    uVar3 = (ulong)(*(int *)&(this->m_alignPosition).m_currentPosition - (int)__src & 3);
  }
  if (uVar3 + numElements * 4 <=
      (ulong)((long)(this->m_lastPosition).m_currentPosition - (long)__src)) {
    __n = numElements * 4;
    this->m_lastDataSize = 4;
    if (numElements == 0) {
      if (this->m_swapBytes != false) {
        return this;
      }
    }
    else {
      __src = __src + uVar3;
      (this->m_currentPosition).m_currentPosition = __src;
      if (this->m_swapBytes != false) {
        if ((long)__n < 1) {
          return this;
        }
        lVar4 = 0;
        do {
          (this->m_currentPosition).m_currentPosition = __src + lVar4 + 1;
          lVar2 = lVar4 + 4;
          local_18[lVar4 + 3] = __src[lVar4];
          (this->m_currentPosition).m_currentPosition = __src + lVar4 + 2;
          local_18[lVar4 + 2] = (__src + lVar4 + 2)[-1];
          (this->m_currentPosition).m_currentPosition = __src + lVar4 + 3;
          local_18[lVar4 + 1] = (__src + lVar4 + 3)[-1];
          (this->m_currentPosition).m_currentPosition = __src + lVar4 + 4;
          local_18[lVar4] = (__src + lVar4 + 4)[-1];
          lVar4 = lVar4 + 4;
        } while (local_18 + lVar2 < local_18 + __n);
        return this;
      }
    }
    memcpy(long_t,__src,__n);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + __n;
    return this;
  }
  this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
  exception::NotEnoughMemoryException::NotEnoughMemoryException
            (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
  __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
              exception::NotEnoughMemoryException::~NotEnoughMemoryException);
}

Assistant:

Cdr& Cdr::deserializeArray(int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&long_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ >> dst[3];
                m_currentPosition++ >> dst[2];
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}